

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,Root root,char *vendor,char *application)

{
  Node *this_00;
  RootNode *this_01;
  char *application_local;
  char *vendor_local;
  Root root_local;
  Fl_Preferences *this_local;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Preferences_002ecfc8;
  this_00 = (Node *)operator_new(0x48);
  Node::Node(this_00,".");
  this->node = this_00;
  this_01 = (RootNode *)operator_new(0x20);
  RootNode::RootNode(this_01,this,root,vendor,application);
  this->rootNode = this_01;
  Node::setRoot(this->node,this->rootNode);
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( Root root, const char *vendor, const char *application ) {
  node = new Node( "." );
  rootNode = new RootNode( this, root, vendor, application );
  node->setRoot(rootNode);
}